

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O3

void xmrig::Buffer::toHex(uint8_t *in,size_t size,uint8_t *out)

{
  size_t sVar1;
  byte bVar2;
  uint8_t uVar3;
  
  if (size != 0) {
    sVar1 = 0;
    do {
      bVar2 = in[sVar1] >> 4;
      uVar3 = bVar2 + 0x57;
      if (in[sVar1] < 0xa0) {
        uVar3 = bVar2 + 0x30;
      }
      out[sVar1 * 2] = uVar3;
      bVar2 = in[sVar1] & 0xf;
      uVar3 = bVar2 + 0x57;
      if (bVar2 < 10) {
        uVar3 = bVar2 + 0x30;
      }
      out[sVar1 * 2 + 1] = uVar3;
      sVar1 = sVar1 + 1;
    } while (size != sVar1);
  }
  return;
}

Assistant:

void xmrig::Buffer::toHex(const uint8_t *in, size_t size, uint8_t *out)
{
    for (size_t i = 0; i < size; i++) {
        out[i * 2]     = hf_bin2hex((in[i] & 0xF0) >> 4);
        out[i * 2 + 1] = hf_bin2hex(in[i] & 0x0F);
    }
}